

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O1

void CMformat_preload(CMConnection conn,CMFormat format)

{
  CManager cm;
  FILE *pFVar1;
  FILE *pFVar2;
  int iVar3;
  __pid_t _Var4;
  undefined8 uVar5;
  pthread_t pVar6;
  FMFormat *pp_Var7;
  FMFormat p_Var8;
  ulong uVar9;
  timespec ts;
  timespec local_40;
  
  cm = conn->cm;
  if (((conn->remote_format_server_ID == cm->FFSserver_identifier) &&
      (cm->FFSserver_identifier != -1)) && (conn->remote_format_server_ID - 1U < 0xfffffffe)) {
    return;
  }
  if (conn->closed != 0) {
    return;
  }
  pp_Var7 = conn->preloaded_formats;
  uVar9 = 0;
  if ((pp_Var7 != (FMFormat *)0x0) && (p_Var8 = *pp_Var7, p_Var8 != (FMFormat)0x0)) {
    uVar9 = 0;
    do {
      if (p_Var8 == format->fmformat) {
        return;
      }
      p_Var8 = pp_Var7[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (p_Var8 != (FMFormat)0x0);
  }
  p_Var8 = format->fmformat;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(cm,CMFormatVerbose);
    if (iVar3 == 0) goto LAB_00122994;
  }
  else if (CMtrace_val[6] == 0) goto LAB_00122994;
  if (CMtrace_PID != 0) {
    pFVar2 = (FILE *)conn->cm->CMTrace_file;
    _Var4 = getpid();
    pVar6 = pthread_self();
    fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar6);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_40);
    fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
  }
  pFVar2 = (FILE *)conn->cm->CMTrace_file;
  uVar5 = name_of_FMformat(p_Var8);
  fprintf(pFVar2,"CMpbio preloading format %s on connection %p\n",uVar5,conn);
LAB_00122994:
  fflush((FILE *)conn->cm->CMTrace_file);
  iVar3 = CMpbio_send_format_preload(p_Var8,conn);
  if (iVar3 == 1) {
    iVar3 = CMtrace_val[6];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(conn->cm,CMFormatVerbose);
    }
    if (iVar3 != 0) {
      fwrite("CMpbio Preload is format ",0x19,1,(FILE *)conn->cm->CMTrace_file);
      pFVar1 = conn->cm->CMTrace_file;
      uVar5 = get_server_ID_FMformat(p_Var8,&local_40);
      fprint_server_ID(pFVar1,uVar5);
      fputc(10,(FILE *)conn->cm->CMTrace_file);
    }
  }
  else if (conn->closed == 0) {
    iVar3 = CMtrace_val[6];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(conn->cm,CMFormatVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)conn->cm->CMTrace_file;
        _Var4 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fwrite("CMpbio preload failed\n",0x16,1,(FILE *)conn->cm->CMTrace_file);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
  }
  uVar9 = uVar9 & 0xffffffff;
  if (conn->preloaded_formats == (FMFormat *)0x0) {
    pp_Var7 = (FMFormat *)INT_CMmalloc(0x10);
  }
  else {
    pp_Var7 = (FMFormat *)INT_CMrealloc(conn->preloaded_formats,uVar9 * 8 + 0x10);
  }
  pp_Var7[uVar9] = format->fmformat;
  pp_Var7[uVar9 + 1] = (FMFormat)0x0;
  conn->preloaded_formats = pp_Var7;
  return;
}

Assistant:

extern void
CMformat_preload(CMConnection conn, CMFormat format)
{
    int load_count = 0;
    FMFormat *loaded_list = conn->preloaded_formats;
    int my_FFSserver_ID = conn->cm->FFSserver_identifier;
    int remote_FFSserver_ID = conn->remote_format_server_ID;
    int preload = 0;

    if (my_FFSserver_ID == -1) preload = 1;   /* we're self hosting formats */
    if (remote_FFSserver_ID == -1) preload = 1;   /* they're self hosting formats */
    if (remote_FFSserver_ID == 0) preload = 1; /* 0 is the unset state, we don't know their server, preload to be safe */
    if (remote_FFSserver_ID != my_FFSserver_ID) preload = 1;  /* if we're both using a format server, but not the same one, preload */

    if (preload == 0) return;

    if (conn->closed) return;

    /* if (CMtrace_on(conn->cm, CMFormatVerbose)) { */
    /* 	int junk; */
    /* 	fprintf(conn->cm->CMTrace_file, "Considering CMpbio Preload of format "); */
    /* 	fprint_server_ID(conn->cm->CMTrace_file, (unsigned char *)get_server_ID_FMformat(format->fmformat, &junk)); */
    /* 	fprintf(conn->cm->CMTrace_file, " value %p\n", format); */
    /* } */
    while (loaded_list && (*loaded_list != NULL)) {
      if (*loaded_list == format->fmformat) return;
	loaded_list++;
	load_count++;
    }
    
    preload_pbio_format(conn, format->fmformat);

    if (conn->preloaded_formats == NULL) {
	loaded_list = malloc(2*sizeof(*loaded_list));
    } else {
	loaded_list = realloc(conn->preloaded_formats, 
			      sizeof(*loaded_list) * (load_count + 2));
    }
    loaded_list[load_count] = format->fmformat;
    loaded_list[load_count+1] = NULL;
    conn->preloaded_formats = loaded_list;
}